

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_tbegin_ppc64(CPUPPCState_conflict2 *env)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = env->msr;
  uVar2 = env->nip;
  env->spr[0x82] =
       (ulong)(((uint)uVar1 & 0x4000) << 0xe | (uint)(uVar1 >> 0x1f) & 0x20000000) |
       0x14000000c000000;
  env->spr[0x81] = ((uint)uVar1 >> 0xe & 1 | (uint)(uVar1 >> 0x3b) & 2) | uVar2;
  env->spr[0x80] = uVar2 + 4;
  env->crf[0] = 0xb;
  return;
}

Assistant:

void helper_tbegin(CPUPPCState *env)
{
    /*
     * As a degenerate implementation, always fail tbegin.  The reason
     * given is "Nesting overflow".  The "persistent" bit is set,
     * providing a hint to the error handler to not retry.  The TFIAR
     * captures the address of the failure, which is this tbegin
     * instruction.  Instruction execution will continue with the next
     * instruction in memory, which is precisely what we want.
     */

    env->spr[SPR_TEXASR] =
        (1ULL << TEXASR_FAILURE_PERSISTENT) |
        (1ULL << TEXASR_NESTING_OVERFLOW) |
        (msr_hv << TEXASR_PRIVILEGE_HV) |
        (msr_pr << TEXASR_PRIVILEGE_PR) |
        (1ULL << TEXASR_FAILURE_SUMMARY) |
        (1ULL << TEXASR_TFIAR_EXACT);
    env->spr[SPR_TFIAR] = env->nip | (msr_hv << 1) | msr_pr;
    env->spr[SPR_TFHAR] = env->nip + 4;
    env->crf[0] = 0xB; /* 0b1010 = transaction failure */
}